

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

void XNVCTRLSetTargetAttribute
               (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,
               int value)

{
  XExtDisplayInfo *target_id_00;
  undefined1 *puVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  xnvCtrlSetAttributeReq *req;
  XExtDisplayInfo *info;
  Display *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 uVar2;
  undefined2 uVar3;
  
  target_id_00 = find_display(in_stack_ffffffffffffffc8);
  if ((target_id_00 == (XExtDisplayInfo *)0x0) || (target_id_00->codes == (XExtCodes *)0x0)) {
    XMissingExtension(in_RDI,nvctrl_extension_name);
  }
  else {
    XNVCTRLCheckTargetData
              ((Display *)CONCAT44(in_ESI,in_EDX),(XExtDisplayInfo *)CONCAT44(in_ECX,in_R8D),
               (int *)CONCAT44(in_R9D,in_stack_ffffffffffffffe0),(int *)target_id_00);
    uVar2 = (undefined2)in_EDX;
    uVar3 = (undefined2)in_ESI;
    if (*(long *)(in_RDI + 0x968) != 0) {
      (*(code *)**(undefined8 **)(in_RDI + 0x968))(in_RDI);
    }
    puVar1 = (undefined1 *)_XGetRequest(in_RDI,3,0x14);
    *puVar1 = (char)target_id_00->codes->major_opcode;
    puVar1[1] = 3;
    *(undefined2 *)(puVar1 + 6) = uVar3;
    *(undefined2 *)(puVar1 + 4) = uVar2;
    *(undefined4 *)(puVar1 + 8) = in_ECX;
    *(undefined4 *)(puVar1 + 0xc) = in_R8D;
    *(undefined4 *)(puVar1 + 0x10) = in_R9D;
    if (*(long *)(in_RDI + 0x968) != 0) {
      (**(code **)(*(long *)(in_RDI + 0x968) + 8))(in_RDI);
    }
    if (*(long *)(in_RDI + 0xd0) != 0) {
      (**(code **)(in_RDI + 0xd0))(in_RDI);
    }
  }
  return;
}

Assistant:

void XNVCTRLSetTargetAttribute (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    int value
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlSetAttributeReq *req;

    XNVCTRLSimpleCheckExtension (dpy, info);
    XNVCTRLCheckTargetData(dpy, info, &target_type, &target_id);

    LockDisplay (dpy);
    GetReq (nvCtrlSetAttribute, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlSetAttribute;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    req->value = value;
    UnlockDisplay (dpy);
    SyncHandle ();
}